

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O3

ssize_t zip_stream_copy(zip_t *zip,void **buf,size_t *bufsize)

{
  void *__dest;
  size_t __nmemb;
  
  if (zip == (zip_t *)0x0) {
    __nmemb = 0xffffffffffffffff;
  }
  else {
    mz_zip_writer_finalize_archive(&zip->archive);
    zip_archive_truncate(&zip->archive);
    __nmemb = (zip->archive).m_archive_size;
    if (bufsize != (size_t *)0x0) {
      *bufsize = __nmemb;
    }
    __dest = calloc(__nmemb,1);
    *buf = __dest;
    memcpy(__dest,((zip->archive).m_pState)->m_pMem,__nmemb);
  }
  return __nmemb;
}

Assistant:

ssize_t zip_stream_copy(struct zip_t *zip, void **buf, size_t *bufsize) {
  size_t n;

  if (!zip) {
    return (ssize_t)ZIP_ENOINIT;
  }
  zip_archive_finalize(&(zip->archive));

  n = (size_t)zip->archive.m_archive_size;
  if (bufsize != NULL) {
    *bufsize = n;
  }

  *buf = calloc(n, sizeof(unsigned char));
  memcpy(*buf, zip->archive.m_pState->m_pMem, n);

  return (ssize_t)n;
}